

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int Wlc_BlastLess2(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits)

{
  int iVar1;
  int iData1;
  int iCtrl;
  ulong uVar2;
  
  iCtrl = 0;
  iData1 = 0;
  uVar2 = (ulong)(uint)nBits;
  do {
    if ((int)uVar2 < 1) {
      return iData1;
    }
    iVar1 = Abc_LitNot(pArg0[uVar2 - 1]);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,pArg1[uVar2 - 1]);
    iData1 = Gia_ManHashMux(pNew,iCtrl,iData1,iVar1);
    iVar1 = Gia_ManHashXor(pNew,pArg0[uVar2 - 1],pArg1[uVar2 - 1]);
    iCtrl = Gia_ManHashOr(pNew,iCtrl,iVar1);
    uVar2 = uVar2 - 1;
  } while (iCtrl != 1);
  return iData1;
}

Assistant:

int Wlc_BlastLess2( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits )
{
    int k, iKnown = 0, iRes = 0;
    for ( k = nBits - 1; k >= 0; k-- )
    {
        iRes   = Gia_ManHashMux( pNew, iKnown, iRes, Gia_ManHashAnd(pNew, Abc_LitNot(pArg0[k]), pArg1[k]) );
        iKnown = Gia_ManHashOr( pNew, iKnown, Gia_ManHashXor(pNew, pArg0[k], pArg1[k]) );
        if ( iKnown == 1 )
            break;
    }
    return iRes;
}